

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O2

void __thiscall
QPDFAcroFormDocumentHelper::setNeedAppearances(QPDFAcroFormDocumentHelper *this,bool val)

{
  bool bVar1;
  allocator<char> in_stack_ffffffffffffffaf;
  undefined1 local_50 [16];
  string local_40;
  QPDFObjectHandle acroform;
  
  QPDF::getRoot((QPDF *)local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_50 + 0x10),"/AcroForm",(allocator<char> *)&stack0xffffffffffffffaf);
  QPDFObjectHandle::getKey(&acroform,(string *)local_50);
  std::__cxx11::string::~string((string *)(local_50 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
  bVar1 = QPDFObjectHandle::isDictionary(&acroform);
  if (bVar1) {
    if (val) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_50 + 0x10),"/NeedAppearances",
                 (allocator<char> *)&stack0xffffffffffffffaf);
      QPDFObjectHandle::newBool((bool)in_stack_ffffffffffffffaf);
      QPDFObjectHandle::replaceKey
                (&acroform,(string *)(local_50 + 0x10),(QPDFObjectHandle *)local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_50 + 0x10),"/NeedAppearances",(allocator<char> *)local_50);
      QPDFObjectHandle::removeKey(&acroform,(string *)(local_50 + 0x10));
    }
    std::__cxx11::string::~string((string *)(local_50 + 0x10));
  }
  else {
    QPDF::getRoot((QPDF *)local_50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_50 + 0x10),
               "ignoring call to QPDFAcroFormDocumentHelper::setNeedAppearances on a file that lacks an /AcroForm dictionary"
               ,(allocator<char> *)&stack0xffffffffffffffaf);
    QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)local_50,(string *)(local_50 + 0x10));
    std::__cxx11::string::~string((string *)(local_50 + 0x10));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&acroform.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void
QPDFAcroFormDocumentHelper::setNeedAppearances(bool val)
{
    QPDFObjectHandle acroform = qpdf.getRoot().getKey("/AcroForm");
    if (!acroform.isDictionary()) {
        qpdf.getRoot().warnIfPossible(
            "ignoring call to QPDFAcroFormDocumentHelper::setNeedAppearances"
            " on a file that lacks an /AcroForm dictionary");
        return;
    }
    if (val) {
        acroform.replaceKey("/NeedAppearances", QPDFObjectHandle::newBool(true));
    } else {
        acroform.removeKey("/NeedAppearances");
    }
}